

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetAllPWMsPololu(POLOLU *pPololu,int *selectedchannels,int *pws)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  int pws_tmp [24];
  uchar sendbuf [512];
  
  bVar11 = 0;
  iVar10 = 0;
  memset(sendbuf,0,0x200);
  if (pPololu->bEnableSetMultipleTargets == 0) {
    piVar8 = pws_tmp;
    for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
      *piVar8 = *pws;
      pws = pws + (ulong)bVar11 * -2 + 1;
      piVar8 = piVar8 + (ulong)bVar11 * -2 + 1;
    }
    iVar7 = 0;
    iVar10 = 0;
    for (lVar4 = -0x18; lVar4 != 0; lVar4 = lVar4 + 1) {
      if (selectedchannels[lVar4 + 0x18] != 0) {
        iVar1 = (int)((double)(*(int *)(sendbuf + lVar4 * 4) + -0x5dc) *
                     *(double *)(pPololu->bProportionalPWs + lVar4 * 2));
        if (*(int *)((long)pPololu->analoginputoffset + lVar4 * 4) == 0) {
          uVar2 = iVar1 + 0x5dc;
        }
        else {
          iVar5 = pPololu->MaxPWs[lVar4];
          if (iVar1 < 0) {
            iVar1 = ((pPololu->MidPWs[lVar4] - iVar5) * iVar1) / -500;
          }
          else {
            iVar1 = ((pPololu->InitPWs[lVar4] - iVar5) * iVar1) / 500;
          }
          uVar2 = iVar1 + iVar5;
        }
        if (pPololu->InitPWs[lVar4] <= (int)uVar2) {
          uVar2 = pPololu->InitPWs[lVar4];
        }
        if ((int)uVar2 <= pPololu->MidPWs[lVar4]) {
          uVar2 = pPololu->MidPWs[lVar4];
        }
        *(uint *)(sendbuf + lVar4 * 4) = uVar2;
        iVar5 = uVar2 - pPololu->LastAIs[lVar4];
        iVar1 = -iVar5;
        if (0 < iVar5) {
          iVar1 = iVar5;
        }
        if (*(int *)((long)pPololu->CoefPWs + lVar4 * 4) <= iVar1) {
          sendbuf[iVar7] = 0xaa;
          sendbuf[(long)iVar7 + 1] = (uchar)pPololu->DeviceNumber;
          sendbuf[(long)iVar7 + 2] = '\x04';
          sendbuf[(long)iVar7 + 3] = (char)lVar4 + '\x18';
          sendbuf[(long)iVar7 + 4] = (char)uVar2 * '\x04' & 0x7c;
          sendbuf[(long)iVar7 + 5] = (byte)(uVar2 >> 5) & 0x7f;
          iVar10 = iVar10 + 1;
          iVar7 = iVar7 + 6;
        }
      }
    }
    if (iVar10 == 0) {
      return 0;
    }
    iVar10 = iVar10 * 6;
  }
  else {
    sendbuf[0] = 0xaa;
    sendbuf[1] = (uchar)pPololu->DeviceNumber;
    sendbuf[2] = '\x1f';
    piVar8 = pws_tmp;
    for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
      *piVar8 = *pws;
      pws = pws + (ulong)bVar11 * -2 + 1;
      piVar8 = piVar8 + (ulong)bVar11 * -2 + 1;
    }
    uVar6 = 0x18;
    iVar7 = 5;
    for (uVar9 = 0; uVar9 != 0x18; uVar9 = uVar9 + 1) {
      if (selectedchannels[uVar9] != 0) {
        if ((long)(iVar10 + (int)uVar6) < (long)uVar9) {
          puts("Pololu multiple channels must be continuous.");
          goto LAB_001195d1;
        }
        iVar1 = (int)((double)(pws_tmp[uVar9] + -0x5dc) * pPololu->CoefPWs[uVar9]);
        if (pPololu->bProportionalPWs[uVar9] == 0) {
          uVar2 = iVar1 + 0x5dc;
        }
        else {
          iVar5 = pPololu->MidPWs[uVar9];
          if (iVar1 < 0) {
            iVar1 = ((pPololu->MinPWs[uVar9] - iVar5) * iVar1) / -500;
          }
          else {
            iVar1 = ((pPololu->MaxPWs[uVar9] - iVar5) * iVar1) / 500;
          }
          uVar2 = iVar1 + iVar5;
        }
        if (pPololu->MaxPWs[uVar9] <= (int)uVar2) {
          uVar2 = pPololu->MaxPWs[uVar9];
        }
        if ((int)uVar2 <= pPololu->MinPWs[uVar9]) {
          uVar2 = pPololu->MinPWs[uVar9];
        }
        iVar5 = uVar2 - pPololu->LastPWs[uVar9];
        iVar1 = -iVar5;
        if (0 < iVar5) {
          iVar1 = iVar5;
        }
        uVar3 = pPololu->LastPWs[uVar9];
        if (pPololu->ThresholdPWs[uVar9] <= iVar1) {
          uVar3 = uVar2;
        }
        pws_tmp[uVar9] = uVar3;
        sendbuf[iVar7] = (char)uVar3 * '\x04' & 0x7c;
        sendbuf[(long)iVar7 + 1] = (byte)(uVar3 >> 5) & 0x7f;
        if ((int)uVar9 < (int)uVar6) {
          uVar6 = uVar9;
        }
        uVar6 = uVar6 & 0xffffffff;
        iVar10 = iVar10 + 1;
        iVar7 = iVar7 + 2;
      }
    }
    if (iVar10 == 0) {
      return 0;
    }
    sendbuf[3] = (uchar)iVar10;
    sendbuf[4] = (uchar)uVar6;
    iVar10 = iVar10 * 2 + 5;
  }
  iVar7 = WriteAllRS232Port(&pPololu->RS232Port,sendbuf,iVar10);
  if (iVar7 == 0) {
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)iVar10,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    iVar10 = 0;
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
      if (selectedchannels[lVar4] != 0) {
        iVar1 = pws_tmp[lVar4] - pPololu->LastPWs[lVar4];
        iVar7 = -iVar1;
        if (0 < iVar1) {
          iVar7 = iVar1;
        }
        if (pPololu->ThresholdPWs[lVar4] <= iVar7) {
          pPololu->LastPWs[lVar4] = pws_tmp[lVar4];
        }
      }
    }
  }
  else {
LAB_001195d1:
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

inline int SetAllPWMsPololu(POLOLU* pPololu, int* selectedchannels, int* pws)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int channel = 0;
	int target = 0;
	int pws_tmp[NB_CHANNELS_PWM_POLOLU];
	int index = 0, firstselectedchannel = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	if (pPololu->bEnableSetMultipleTargets)
	{
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[2] = (unsigned char)(SET_MULTIPLE_TARGETS_COMMAND_POLOLU & 0x7F);

		firstselectedchannel = NB_CHANNELS_PWM_POLOLU;
		nbselectedchannels = 0;
		index = 5;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			// To check...
			if (channel > firstselectedchannel+nbselectedchannels)
			{
				printf("Pololu multiple channels must be continuous.\n");
				return EXIT_FAILURE;
			}

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) pws_tmp[channel] = pPololu->LastPWs[channel];

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			target = pws_tmp[channel]*4;
			sendbuf[index] = (unsigned char)(target & 0x7F);
			sendbuf[index+1] = (unsigned char)((target >> 7) & 0x7F);

			firstselectedchannel = min(channel, firstselectedchannel);
			nbselectedchannels++;
			index += 2;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuf[3] = (unsigned char)nbselectedchannels;
		sendbuf[4] = (unsigned char)firstselectedchannel;

		sendbuflen = 5+2*nbselectedchannels;
	}
	else
	{
		nbselectedchannels = 0;
		index = 0;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
			sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
			sendbuf[index+2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
			sendbuf[index+3] = (unsigned char)channel;
			target = pws_tmp[channel]*4;
			sendbuf[index+4] = (unsigned char)(target & 0x7F);
			sendbuf[index+5] = (unsigned char)((target >> 7) & 0x7F);

			nbselectedchannels++;
			index += 6;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuflen = 6*nbselectedchannels;
	}

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

		// Update last known value.
		pPololu->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}